

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::editmute_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  stringformatter local_140;
  char local_138 [8];
  string mutemsg;
  clientinfo *ci;
  int cn;
  bool usage;
  int argc_local;
  char **args_local;
  int cid_local;
  
  bVar1 = false;
  bVar2 = QServ::getlastSA(&qs);
  if (bVar2) {
    ci._4_4_ = atoi(args[1]);
    if ((ci._4_4_ < 0) || (1000 < ci._4_4_)) {
      bVar1 = true;
      goto LAB_0018df0d;
    }
  }
  else {
    ci._4_4_ = QServ::getSender(&qs);
  }
  register0x00000000 = QServ::getClient(&qs,ci._4_4_);
  if (register0x00000000 == (clientinfo *)0x0) {
    iVar3 = QServ::getSender(&qs);
    sendf(iVar3,1,"ris",0x23,"\f3Error: Player not connected");
  }
  else if (((((register0x00000000->connected & 1U) != 0) &&
            (iVar3 = QServ::getSender(&qs), ci._4_4_ != iVar3)) && (-1 < ci._4_4_)) &&
          (((ci._4_4_ < 0x3e9 && (stack0xffffffffffffffd0 != (clientinfo *)0x0)) &&
           (((stack0xffffffffffffffd0->connected & 1U) != 0 && (args[1] != (char *)0x0)))))) {
    stack0xffffffffffffffd0->isEditMuted = true;
    sendf(stack0xffffffffffffffd0->clientnum,1,"ris",0x23,
          "\f7Your edits \f3will not \f7show up to others.");
    stringformatter::stringformatter(&local_140,local_138);
    pcVar4 = colorname(stack0xffffffffffffffd0);
    stringformatter::operator()(&local_140,"\f0%s\f7\'s edits have been \f3muted",pcVar4);
    iVar3 = QServ::getSender(&qs);
    sendf(iVar3,1,"ris",0x23,local_138);
  }
LAB_0018df0d:
  if (bVar1) {
    iVar3 = QServ::getSender(&qs);
    pcVar4 = QServ::getCommandDesc(&qs,cid);
    sendf(iVar3,1,"ris",0x23,pcVar4);
  }
  return;
}

Assistant:

QSERV_CALLBACK editmute_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    editmuteprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                             if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                ci->isEditMuted = true;
                                sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f7Your edits \f3will not \f7show up to others.");
                                   defformatstring(mutemsg)("\f0%s\f7's edits have been \f3muted", colorname(ci));
                                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, mutemsg);
                                }
                                                   
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto editmuteprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }